

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O2

void __thiscall
rlottie::Animation::setValue(void *param_1,Animation *this,Property param_3,string *param_4)

{
  _Head_base<0UL,_AnimationImpl_*,_false> this_00;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  LOTVariant local_48;
  
  this_00._M_head_impl =
       (this->d)._M_t.super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t
       .super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
       super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<rlottie::Size_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:402:34)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<rlottie::Size_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:402:34)>
             ::_M_manager;
  local_68._M_unused._M_object = param_1;
  LOTVariant::LOTVariant(&local_48,param_3,(SizeFunc *)&local_68);
  AnimationImpl::setValue(this_00._M_head_impl,param_4,&local_48);
  LOTVariant::Destroy(&local_48);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

void Animation::setValue(Size_Type, Property prop, const std::string &keypath,
                         Size value)
{
    d->setValue(keypath,
                LOTVariant(prop, [value](const FrameInfo &) { return value; }));
}